

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  Float FVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  size_t in_RCX;
  Point3<float> *p1;
  long lVar5;
  bool bVar6;
  type tVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  span<const_pbrt::Point3<float>_> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  
  cp.n = in_RCX;
  cp.ptr = (Point3<float> *)0x4;
  CubicBezierControlPoints<pbrt::Point3<float>>
            ((array<pbrt::Point3<float>,_4> *)cpObj.values,(pbrt *)this->common->cpObj,cp,this->uMin
             ,this->uMax);
  uVar3._0_4_ = this->uMin;
  uVar3._4_4_ = this->uMax;
  fVar11 = 0.0;
  FVar1 = this->common->width[0];
  fVar2 = this->common->width[1];
  lVar5 = 3;
  p1 = cpObj.values;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    tVar7 = Distance<float>(p1,p1 + 1);
    fVar11 = fVar11 + tVar7;
    p1 = p1 + 1;
  }
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar3;
  auVar4 = vsubps_avx(auVar8,auVar4);
  auVar9._0_4_ = fVar2 * (float)(undefined4)uVar3;
  auVar9._4_4_ = fVar2 * (float)uVar3._4_4_;
  auVar9._8_4_ = fVar2 * 0.0;
  auVar9._12_4_ = fVar2 * 0.0;
  auVar10._4_4_ = FVar1;
  auVar10._0_4_ = FVar1;
  auVar10._8_4_ = FVar1;
  auVar10._12_4_ = FVar1;
  auVar4 = vfmadd213ps_fma(auVar10,auVar4,auVar9);
  auVar4 = vhaddps_avx(auVar4,auVar4);
  return auVar4._0_4_ * 0.5 * fVar11;
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}